

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteProperty<duckdb::optional_idx>
          (Serializer *this,field_id_t field_id,char *tag,optional_idx *value)

{
  undefined6 in_register_00000032;
  
  (*this->_vptr_Serializer[2])(this,CONCAT62(in_register_00000032,field_id));
  WriteValue(this,(optional_idx)value->index);
  (*this->_vptr_Serializer[3])(this);
  return;
}

Assistant:

void WriteProperty(const field_id_t field_id, const char *tag, const T &value) {
		OnPropertyBegin(field_id, tag);
		WriteValue(value);
		OnPropertyEnd();
	}